

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_oarchive_impl.cpp
# Opt level: O0

void __thiscall boost::archive::json_oarchive_impl::save_end(json_oarchive_impl *this,char *name)

{
  int iVar1;
  reference pvVar2;
  char *name_local;
  json_oarchive_impl *this_local;
  
  if (name != (char *)0x0) {
    json_archive::pop_data(&(this->super_json_archive_interface).archive_);
    iVar1 = (this->super_json_archive_interface).array_level_ + -1;
    (this->super_json_archive_interface).array_level_ = iVar1;
    pvVar2 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->array_stack_,(long)iVar1);
    if ((pvVar2->second & 1U) != 0) {
      json_archive::pop_data(&(this->super_json_archive_interface).archive_);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::resize(&this->array_stack_,(long)((this->super_json_archive_interface).array_level_ + 1));
  }
  return;
}

Assistant:

void json_oarchive_impl::save_end(const char* name)
{
    if(!name)
    {
        return;
    }
    //
    archive_.pop_data();
    if(array_stack_[--array_level_].second)
    {
        archive_.pop_data();
    }
    array_stack_.resize(array_level_ + 1);
}